

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double * circular_normal_sample(double *a,double b,int *seed)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double *x;
  double v2;
  double v1;
  double r;
  double r8_pi;
  int *seed_local;
  double b_local;
  double *a_local;
  
  pdVar1 = (double *)operator_new__(0x10);
  dVar2 = r8_uniform_01(seed);
  dVar3 = r8_uniform_01(seed);
  dVar2 = log(dVar2);
  dVar4 = sqrt(dVar2 * -2.0);
  dVar2 = *a;
  dVar5 = cos(dVar3 * 6.283185307179586);
  *pdVar1 = b * dVar4 * dVar5 + dVar2;
  dVar2 = a[1];
  dVar3 = sin(dVar3 * 6.283185307179586);
  pdVar1[1] = b * dVar4 * dVar3 + dVar2;
  return pdVar1;
}

Assistant:

double *circular_normal_sample ( double a[2], double b, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    CIRCULAR_NORMAL_SAMPLE samples the Circular Normal PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    03 January 2011
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A[2], a parameter of the PDF, the mean value.
//
//    Input, double B, a parameter of the PDF, the standard deviation.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double CIRCULAR_NORMAL_SAMPLE[2], a sample of the PDF.
//
{
  const double r8_pi = 3.14159265358979323;
  double r;
  double v1;
  double v2;
  double *x;

  x = new double[2];

  v1 = r8_uniform_01 ( seed );
  v2 = r8_uniform_01 ( seed );

  r = sqrt ( - 2.0 * log ( v1 ) );

  x[0] = a[0] + b * r * cos ( 2.0 * r8_pi * v2 );
  x[1] = a[1] + b * r * sin ( 2.0 * r8_pi * v2 );

  return x;
}